

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O3

int __thiscall Centaurus::ATNPath::count(ATNPath *this,Identifier *id,int index)

{
  pointer ppVar1;
  pointer pwVar2;
  wchar_t *__s2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  bool bVar6;
  wchar_t *local_58;
  size_t local_50;
  wchar_t local_48 [4];
  int local_38;
  
  ppVar5 = (this->
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = local_48;
  pwVar2 = (id->m_id)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_58,pwVar2,pwVar2 + (id->m_id)._M_string_length);
  __s2 = local_58;
  iVar4 = 0;
  local_38 = index;
  for (; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    bVar6 = (ppVar5->first).m_id._M_string_length == local_50;
    if (bVar6 && local_50 != 0) {
      iVar3 = wmemcmp((ppVar5->first).m_id._M_dataplus._M_p,__s2,local_50);
      bVar6 = iVar3 == 0;
    }
    iVar4 = iVar4 + (uint)(byte)(ppVar5->second == index & bVar6);
  }
  if (__s2 != local_48) {
    operator_delete(__s2);
  }
  return iVar4;
}

Assistant:

int count(const Identifier& id, int index) const
    {
        return std::count(cbegin(), cend(), std::pair<Identifier, int>(id, index));
    }